

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void get_min_bsize(SIMPLE_MOTION_DATA_TREE *sms_tree,int *min_bw,int *min_bh)

{
  BLOCK_SIZE BVar1;
  uint uVar2;
  uint *in_RDX;
  SIMPLE_MOTION_DATA_TREE *in_RSI;
  char *in_RDI;
  BLOCK_SIZE subsize;
  int i;
  PARTITION_TYPE part_type;
  BLOCK_SIZE bsize;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_28;
  int iVar3;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 uVar4;
  char cVar5;
  
  if (in_RDI != (char *)0x0) {
    cVar5 = *in_RDI;
    if (cVar5 == '\0') {
      in_RSI->block_size = BLOCK_4X4;
      in_RSI->partitioning = '\0';
      *(undefined2 *)&in_RSI->field_0x2 = 0;
      *in_RDX = 0;
    }
    else if (in_RDI[1] != -1) {
      if (in_RDI[1] == '\x03') {
        uVar4 = 3;
        for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
          get_min_bsize(in_RSI,(int *)in_RDX,
                        (int *)CONCAT17(cVar5,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffffe4,
                                                                      iVar3))));
        }
      }
      else {
        BVar1 = get_partition_subsize
                          ((BLOCK_SIZE)((uint)in_stack_ffffffffffffffd4 >> 0x10),
                           (PARTITION_TYPE)((uint)in_stack_ffffffffffffffd4 >> 8));
        if (BVar1 != BLOCK_INVALID) {
          uVar2._0_1_ = in_RSI->block_size;
          uVar2._1_1_ = in_RSI->partitioning;
          uVar2._2_2_ = *(undefined2 *)&in_RSI->field_0x2;
          if ((int)uVar2 < (int)(uint)""[BVar1]) {
            local_28._0_1_ = in_RSI->block_size;
            local_28._1_1_ = in_RSI->partitioning;
            local_28._2_2_ = *(undefined2 *)&in_RSI->field_0x2;
          }
          else {
            local_28 = (uint)""[BVar1];
          }
          in_RSI->block_size = (undefined1)local_28;
          in_RSI->partitioning = local_28._1_1_;
          *(undefined2 *)&in_RSI->field_0x2 = local_28._2_2_;
          if ((int)*in_RDX < (int)(uint)""[BVar1]) {
            uVar2 = *in_RDX;
          }
          else {
            uVar2 = (uint)""[BVar1];
          }
          *in_RDX = uVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void get_min_bsize(const SIMPLE_MOTION_DATA_TREE *sms_tree,
                                 int *min_bw, int *min_bh) {
  if (!sms_tree) return;

  const BLOCK_SIZE bsize = sms_tree->block_size;
  if (bsize == BLOCK_4X4) {
    *min_bw = 0;
    *min_bh = 0;
    return;
  }

  PARTITION_TYPE part_type = sms_tree->partitioning;
  if (part_type == PARTITION_INVALID) return;

  if (part_type == PARTITION_SPLIT) {
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
      get_min_bsize(sms_tree->split[i], min_bw, min_bh);
    }
  } else {
    if (part_type == PARTITION_HORZ_A || part_type == PARTITION_HORZ_B ||
        part_type == PARTITION_VERT_A || part_type == PARTITION_VERT_B)
      part_type = PARTITION_SPLIT;
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, part_type);
    if (subsize != BLOCK_INVALID) {
      *min_bw = AOMMIN(*min_bw, mi_size_wide_log2[subsize]);
      *min_bh = AOMMIN(*min_bh, mi_size_high_log2[subsize]);
    }
  }
}